

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  Mem *pMem;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *__s1;
  char *__s2;
  byte bVar6;
  ulong val;
  uint uVar7;
  ushort uVar8;
  
  uVar8 = (*argv)->flags & 0x3f;
  bVar6 = (byte)argv[1]->flags & 0x3f;
  if ((((uint)(0xaaaaaaaaaaaaaaaa >> bVar6) | (uint)(0xaaaaaaaaaaaaaaaa >> (sbyte)uVar8)) & 1) == 0)
  {
    iVar3 = sqlite3ValueBytes(*argv,'\x01');
    uVar4 = sqlite3ValueBytes(argv[1],'\x01');
    if ((int)uVar4 < 1) {
      val = 1;
    }
    else {
      if (((byte)(0x1000000010001 >> bVar6) & (0x1000000010001U >> uVar8 & 1) != 0) == 1) {
        __s1 = (char *)sqlite3_value_blob(*argv);
        __s2 = (char *)sqlite3_value_blob(argv[1]);
      }
      else {
        __s1 = (char *)sqlite3ValueText(*argv,'\x01');
        __s2 = (char *)sqlite3ValueText(argv[1],'\x01');
      }
      if (__s2 == (char *)0x0) {
        return;
      }
      if (iVar3 != 0 && __s1 == (char *)0x0) {
        return;
      }
      if (iVar3 < (int)uVar4) {
        val = 0;
      }
      else {
        cVar1 = *__s2;
        uVar7 = 1;
        do {
          if ((*__s1 == cVar1) && (iVar5 = bcmp(__s1,__s2,(ulong)uVar4), iVar5 == 0))
          goto LAB_001bd212;
          uVar7 = uVar7 + 1;
          __s1 = __s1 + 1;
          bVar2 = (int)uVar4 < iVar3;
          iVar3 = iVar3 + -1;
        } while (bVar2);
        uVar7 = 0;
LAB_001bd212:
        val = (ulong)uVar7;
      }
    }
    pMem = context->pOut;
    if ((pMem->flags & 0x2400) != 0) {
      vdbeReleaseAndSetInt64(pMem,val);
      return;
    }
    (pMem->u).i = val;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;
  unsigned char firstChar;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else{
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) return;
    firstChar = zNeedle[0];
    while( nNeedle<=nHaystack
       && (zHaystack[0]!=firstChar || memcmp(zHaystack, zNeedle, nNeedle)!=0)
    ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
}